

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int block_follow(LexState *ls,int withuntil)

{
  int iVar1;
  int withuntil_local;
  LexState *ls_local;
  
  iVar1 = (ls->t).token;
  if (2 < iVar1 - 0x104U) {
    if (iVar1 == 0x115) {
      return withuntil;
    }
    if (iVar1 != 0x121) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int block_follow (LexState *ls, int withuntil) {
  switch (ls->t.token) {
    case TK_ELSE: case TK_ELSEIF:
    case TK_END: case TK_EOS:
      return 1;
    case TK_UNTIL: return withuntil;
    default: return 0;
  }
}